

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  FieldDescriptorProto *field;
  undefined8 *puVar4;
  LocationRecorder location;
  string extendee;
  LocationRecorder extendee_location;
  Token extendee_end;
  Token extendee_start;
  
  bVar2 = Consume(this,"extend");
  if (bVar2) {
    io::Tokenizer::Token::Token(&extendee_start,&this->input_->current_);
    extendee._M_dataplus._M_p = (pointer)&extendee.field_2;
    extendee._M_string_length = 0;
    extendee.field_2._M_local_buf[0] = '\0';
    bVar2 = ParseUserDefinedType(this,&extendee);
    if (bVar2) {
      io::Tokenizer::Token::Token(&extendee_end,&this->input_->previous_);
      bVar2 = ConsumeEndOfDeclaration(this,"{",extend_location);
      if (bVar2) {
        bVar2 = true;
        do {
          if ((this->input_->current_).type == TYPE_END) {
            std::__cxx11::string::string
                      ((string *)&location,
                       "Reached end of input in extend definition (missing \'}\').",
                       (allocator *)&extendee_location);
            AddError(this,(string *)&location);
            std::__cxx11::string::~string((string *)&location);
            goto LAB_0034f560;
          }
          LocationRecorder::LocationRecorder
                    (&location,extend_location,
                     (extensions->super_RepeatedPtrFieldBase).current_size_);
          field = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(extensions);
          LocationRecorder::LocationRecorder(&extendee_location,&location,2);
          LocationRecorder::StartAt(&extendee_location,&extendee_start);
          LocationRecorder::EndAt(&extendee_location,&extendee_end);
          if (bVar2) {
            LocationRecorder::RecordLegacyLocation
                      (&extendee_location,&field->super_Message,EXTENDEE);
          }
          LocationRecorder::~LocationRecorder(&extendee_location);
          *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 2;
          uVar1 = (field->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
          if ((uVar1 & 1) != 0) {
            puVar4 = (undefined8 *)*puVar4;
          }
          internal::ArenaStringPtr::Set(&field->extendee_,&extendee,puVar4);
          bVar2 = ParseMessageField(this,field,messages,parent_location,
                                    location_field_number_for_nested_type,&location,containing_file)
          ;
          if (!bVar2) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&location);
          bVar3 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
          bVar2 = false;
        } while (!bVar3);
        bVar2 = true;
      }
      else {
LAB_0034f560:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&extendee_end.text);
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&extendee);
    std::__cxx11::string::~string((string *)&extendee_start.text);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  std::string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      AddError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type, location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}